

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::ProcessStatsConfig::ParseFromArray
          (ProcessStatsConfig *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pPVar2;
  iterator __position;
  bool bVar3;
  short sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  ProcessStatsConfig_Quirks *pPVar10;
  uint8_t cur_byte_3;
  uint8_t cur_byte_2;
  ulong *puVar11;
  uint8_t cur_byte;
  ulong uVar12;
  uint8_t cur_byte_1;
  ulong *puVar13;
  Field local_58;
  ProcessStatsConfig *local_48;
  vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pPVar2 = (this->quirks_).
           super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->quirks_).
      super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar2) {
    (this->quirks_).
    super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar2;
  }
  (this->unknown_fields_)._M_string_length = 0;
  local_40 = &this->quirks_;
  local_38 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (ulong *)(size + (long)raw);
  do {
    if (puVar9 <= raw) goto switchD_00232515_caseD_3;
    bVar1 = (byte)*raw;
    uVar8 = (ulong)bVar1;
    puVar11 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar8 = (ulong)(bVar1 & 0x7f);
      lVar6 = 7;
      do {
        if ((puVar9 <= puVar11) || (0x38 < lVar6 - 7U)) goto switchD_00232515_caseD_3;
        uVar5 = *puVar11;
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar8 = uVar8 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
        lVar6 = lVar6 + 7;
      } while ((char)(byte)uVar5 < '\0');
    }
    uVar5 = uVar8 >> 3;
    if (((uint)uVar5 == 0) || (puVar9 <= puVar11)) goto switchD_00232515_caseD_3;
    switch((uint)uVar8 & 7) {
    case 0:
      uVar7 = 0;
      uVar12 = 0;
      while( true ) {
        puVar13 = (ulong *)((long)puVar11 + 1);
        uVar7 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar7;
        if (-1 < (char)(byte)*puVar11) break;
        if ((puVar9 <= puVar13) ||
           (bVar3 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar3))
        goto switchD_00232515_caseD_3;
      }
      local_58.int_value_ = uVar7 & 0xffffffff00000000;
      break;
    case 1:
      puVar13 = puVar11 + 1;
      if (puVar9 < puVar13) goto switchD_00232515_caseD_3;
      uVar7 = *puVar11;
      local_58.int_value_ = uVar7 & 0xffffffff00000000;
      break;
    case 2:
      puVar11 = (ulong *)((long)puVar11 + 1);
      uVar12 = 0;
      uVar7 = 0;
      puVar13 = puVar11;
      while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar7 & 0x3f) | uVar12
            , (char)*(byte *)((long)puVar13 + -1) < '\0') {
        if (puVar9 <= puVar13) goto switchD_00232515_caseD_3;
        puVar13 = (ulong *)((long)puVar13 + 1);
        puVar11 = (ulong *)((long)puVar11 + 1);
        bVar3 = 0x38 < uVar7;
        uVar7 = uVar7 + 7;
        if (bVar3) goto switchD_00232515_caseD_3;
      }
      if (uVar12 <= (ulong)((long)puVar9 - (long)puVar11)) {
        local_58.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
        puVar13 = (ulong *)((long)puVar13 + uVar12);
        uVar7 = (ulong)puVar11 & 0xffffffff;
        goto LAB_002325f2;
      }
    default:
      goto switchD_00232515_caseD_3;
    case 5:
      puVar13 = (ulong *)((long)puVar11 + 4);
      if (puVar9 < puVar13) goto switchD_00232515_caseD_3;
      uVar7 = (ulong)(uint)*puVar11;
      local_58.int_value_ = 0;
    }
    uVar12 = 0;
LAB_002325f2:
    raw = puVar13;
  } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar12));
  local_58.int_value_ = local_58.int_value_ | uVar7 & 0xffffffff;
  uVar7 = uVar5 << 0x20 | uVar12;
  local_58.type_ = (byte)(uVar7 >> 0x30) | (byte)uVar8 & 7;
  local_58.size_ = (uint32_t)uVar12;
  local_58.id_ = (uint16_t)(uVar7 >> 0x20);
  sVar4 = (short)uVar5;
  while (sVar4 != 0) {
    if ((ushort)uVar5 < 7) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar5 & 0x3f);
    }
    switch((uint)uVar5 & 0xffff) {
    case 1:
      __position._M_current =
           (this->quirks_).
           super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->quirks_).
          super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
        ::_M_realloc_insert<>(local_40,__position);
        pPVar10 = (this->quirks_).
                  super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = ProcessStatsConfig_Quirks_QUIRKS_UNSPECIFIED;
        pPVar10 = __position._M_current + 1;
        (this->quirks_).
        super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPVar10;
      }
      pPVar10[-1] = (ProcessStatsConfig_Quirks)local_58.int_value_;
      break;
    case 2:
      this->scan_all_processes_on_start_ = local_58.int_value_ != 0;
      break;
    case 3:
      this->record_thread_names_ = local_58.int_value_ != 0;
      break;
    case 4:
      this->proc_stats_poll_ms_ = (uint32_t)local_58.int_value_;
      break;
    default:
      local_48 = this;
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,local_38);
      this = local_48;
      break;
    case 6:
      this->proc_stats_cache_ttl_ms_ = (uint32_t)local_58.int_value_;
    }
    do {
      if (puVar9 <= raw) goto switchD_00232515_caseD_3;
      bVar1 = (byte)*raw;
      uVar8 = (ulong)(uint)bVar1;
      puVar11 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar8 = (ulong)(bVar1 & 0x7f);
        lVar6 = 7;
        do {
          if ((puVar9 <= puVar11) || (0x38 < lVar6 - 7U)) goto switchD_00232515_caseD_3;
          uVar5 = *puVar11;
          puVar11 = (ulong *)((long)puVar11 + 1);
          uVar8 = uVar8 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
          lVar6 = lVar6 + 7;
        } while ((char)(byte)uVar5 < '\0');
      }
      uVar5 = uVar8 >> 3;
      if (((uint)uVar5 == 0) || (puVar9 <= puVar11)) goto switchD_00232515_caseD_3;
      switch((uint)uVar8 & 7) {
      case 0:
        uVar7 = 0;
        uVar12 = 0;
        while( true ) {
          puVar13 = (ulong *)((long)puVar11 + 1);
          uVar7 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar7;
          if (-1 < (char)(byte)*puVar11) break;
          if ((puVar9 <= puVar13) ||
             (bVar3 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar3))
          goto switchD_00232515_caseD_3;
        }
        local_58.int_value_ = uVar7 & 0xffffffff00000000;
        break;
      case 1:
        puVar13 = puVar11 + 1;
        if (puVar9 < puVar13) goto switchD_00232515_caseD_3;
        uVar7 = *puVar11;
        local_58.int_value_ = uVar7 & 0xffffffff00000000;
        break;
      case 2:
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar12 = 0;
        uVar7 = 0;
        puVar13 = puVar11;
        while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar7 & 0x3f) |
                        uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
          if (puVar9 <= puVar13) goto switchD_00232515_caseD_3;
          puVar13 = (ulong *)((long)puVar13 + 1);
          puVar11 = (ulong *)((long)puVar11 + 1);
          bVar3 = 0x38 < uVar7;
          uVar7 = uVar7 + 7;
          if (bVar3) goto switchD_00232515_caseD_3;
        }
        if (uVar12 <= (ulong)((long)puVar9 - (long)puVar11)) {
          local_58.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
          puVar13 = (ulong *)((long)puVar13 + uVar12);
          uVar7 = (ulong)puVar11 & 0xffffffff;
          goto LAB_00232929;
        }
      default:
        goto switchD_00232515_caseD_3;
      case 5:
        puVar13 = (ulong *)((long)puVar11 + 4);
        if (puVar9 < puVar13) goto switchD_00232515_caseD_3;
        uVar7 = (ulong)(uint)*puVar11;
        local_58.int_value_ = 0;
      }
      uVar12 = 0;
LAB_00232929:
      raw = puVar13;
    } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar12));
    local_58.int_value_ = local_58.int_value_ | uVar7 & 0xffffffff;
    uVar7 = uVar5 << 0x20 | uVar12;
    local_58.type_ = (byte)(uVar7 >> 0x30) | (byte)uVar8 & 7;
    local_58.size_ = (uint32_t)uVar12;
    local_58.id_ = (uint16_t)(uVar7 >> 0x20);
    sVar4 = (short)uVar5;
  }
switchD_00232515_caseD_3:
  return puVar9 == (ulong *)raw;
}

Assistant:

bool ProcessStatsConfig::ParseFromArray(const void* raw, size_t size) {
  quirks_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* quirks */:
        quirks_.emplace_back();
        field.get(&quirks_.back());
        break;
      case 2 /* scan_all_processes_on_start */:
        field.get(&scan_all_processes_on_start_);
        break;
      case 3 /* record_thread_names */:
        field.get(&record_thread_names_);
        break;
      case 4 /* proc_stats_poll_ms */:
        field.get(&proc_stats_poll_ms_);
        break;
      case 6 /* proc_stats_cache_ttl_ms */:
        field.get(&proc_stats_cache_ttl_ms_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}